

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O1

string * minibag::Recorder::timeToStr<miniros::WallTime>
                   (string *__return_storage_ptr__,WallTime ros_t)

{
  tm *__tp;
  size_t sVar1;
  time_t time;
  char timeString [1024];
  time_t local_420;
  char local_418 [1032];
  
  local_420 = ::time((time_t *)0x0);
  __tp = gmtime(&local_420);
  strftime(local_418,0x400,"%Y-%m-%d-%H-%M-%S",__tp);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_418,local_418 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Recorder::timeToStr(T ros_t)
{
  (void)ros_t;

  char timeString[1024];
  
  // Example of the very popular RFC 3339 format UTC time
  std::time_t time = std::time({});
  std::strftime(timeString, sizeof(timeString), "%Y-%m-%d-%H-%M-%S", std::gmtime(&time));
  
  return std::string(timeString);
}